

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

char * docopt::value::kindAsString(Kind kind)

{
  if (kind < (StringList|Bool)) {
    return &DAT_00156024 + *(int *)(&DAT_00156024 + (ulong)kind * 4);
  }
  return "unknown";
}

Assistant:

static const char* kindAsString(Kind kind) {
			switch (kind) {
				case Kind::Empty: return "empty";
				case Kind::Bool: return "bool";
				case Kind::Long: return "long";
				case Kind::String: return "string";
				case Kind::StringList: return "string-list";
			}
			return "unknown";
		}